

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

void uv__run_timers(uv_loop_t *loop)

{
  uv_timer_t *handle;
  void *pvVar1;
  
  while ((pvVar1 = (loop->timer_heap).min, pvVar1 != (void *)0x0 &&
         (*(ulong *)((long)pvVar1 + 0x18) <= loop->time))) {
    handle = (uv_timer_t *)((long)pvVar1 + -0x68);
    uv_timer_stop(handle);
    uv_timer_again(handle);
    (**(code **)((long)pvVar1 + -8))(handle);
  }
  return;
}

Assistant:

void uv__run_timers(uv_loop_t* loop) {
  struct heap_node* heap_node;
  uv_timer_t* handle;

  for (;;) {
    heap_node = heap_min((struct heap*) &loop->timer_heap);
    if (heap_node == NULL)
      break;

    handle = container_of(heap_node, uv_timer_t, heap_node);
    if (handle->timeout > loop->time)
      break;

    uv_timer_stop(handle);
    uv_timer_again(handle);
    handle->timer_cb(handle);
  }
}